

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
doInsert<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>>
          (pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          *this,DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                *keyval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  pointer pcVar6;
  size_t __n;
  size_type *psVar7;
  undefined8 uVar8;
  _Head_base<0UL,_Rml::DataModel_*,_false> __p;
  int iVar9;
  size_t sVar10;
  long lVar11;
  bool bVar12;
  ulong insertion_idx;
  uint8_t *puVar13;
  NodePtr pDVar14;
  string *this_00;
  uint uVar15;
  long lVar16;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  _Head_base<0UL,_Rml::DataModel_*,_false> local_38;
  
  do {
    sVar10 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)keyval);
    uVar15 = ((uint)sVar10 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar5 = *(int *)(this + 0x28);
    insertion_idx = sVar10 >> 5 & *(ulong *)(this + 0x18);
    lVar16 = *(long *)(this + 8);
    bVar4 = *(byte *)(lVar16 + insertion_idx);
    while (uVar15 = uVar15 + iVar5, uVar15 < bVar4) {
      pbVar3 = (byte *)(lVar16 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
      bVar4 = *pbVar3;
    }
    if (uVar15 == *(byte *)(lVar16 + insertion_idx)) {
      pcVar6 = (keyval->mData).first._M_dataplus._M_p;
      __n = (keyval->mData).first._M_string_length;
      pDVar14 = (NodePtr)(insertion_idx * 0x28 + *(long *)this);
      do {
        if ((__n == (pDVar14->mData).first._M_string_length) &&
           ((__n == 0 ||
            (iVar9 = bcmp(pcVar6,(pDVar14->mData).first._M_dataplus._M_p,__n), iVar9 == 0)))) {
          puVar13 = (uint8_t *)(lVar16 + insertion_idx);
          bVar12 = false;
          goto LAB_001ed32d;
        }
        uVar15 = uVar15 + iVar5;
        pbVar3 = (byte *)(lVar16 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        pDVar14 = pDVar14 + 1;
      } while (uVar15 == *pbVar3);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar5 + uVar15) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar11 = 1;
      do {
        lVar11 = lVar11 + -1;
        pcVar2 = (char *)(lVar16 + insertion_idx);
        lVar16 = lVar16 + 1;
      } while (*pcVar2 != '\0');
      this_00 = (string *)(*(long *)this + insertion_idx * 0x28);
      if (lVar11 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar6 = (keyval->mData).first._M_dataplus._M_p;
        paVar1 = &(keyval->mData).first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar6 == paVar1) {
          uVar8 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
          *(undefined8 *)(this_00 + 0x18) = uVar8;
        }
        else {
          *(pointer *)this_00 = pcVar6;
          *(size_type *)(this_00 + 0x10) = paVar1->_M_allocated_capacity;
        }
        *(size_type *)(this_00 + 8) = (keyval->mData).first._M_string_length;
        (keyval->mData).first._M_dataplus._M_p = (pointer)paVar1;
        (keyval->mData).first._M_string_length = 0;
        (keyval->mData).first.field_2._M_local_buf[0] = '\0';
        *(DataModel **)(this_00 + 0x20) =
             (keyval->mData).second._M_t.
             super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
             super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
             super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl;
        (keyval->mData).second._M_t.
        super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
        super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
        super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl = (DataModel *)0x0;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar11,insertion_idx);
        local_58 = &local_48;
        psVar7 = (size_type *)(keyval->mData).first._M_dataplus._M_p;
        paVar1 = &(keyval->mData).first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7 == paVar1) {
          local_48 = paVar1->_M_allocated_capacity;
          uStack_40 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
        }
        else {
          local_48 = paVar1->_M_allocated_capacity;
          local_58 = psVar7;
        }
        local_50 = (keyval->mData).first._M_string_length;
        (keyval->mData).first._M_dataplus._M_p = (pointer)paVar1;
        (keyval->mData).first._M_string_length = 0;
        (keyval->mData).first.field_2._M_local_buf[0] = '\0';
        local_38._M_head_impl =
             (keyval->mData).second._M_t.
             super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
             super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
             super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl;
        (keyval->mData).second._M_t.
        super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
        super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
        super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl = (DataModel *)0x0;
        std::__cxx11::string::operator=(this_00,(string *)&local_58);
        __p._M_head_impl = local_38._M_head_impl;
        local_38._M_head_impl = (DataModel *)0x0;
        std::__uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::reset
                  ((__uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_> *)
                   (this_00 + 0x20),__p._M_head_impl);
        std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::~unique_ptr
                  ((unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_> *)&local_38);
        if (local_58 != &local_48) {
          operator_delete(local_58,local_48 + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar15;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      pDVar14 = (NodePtr)(insertion_idx * 0x28 + *(long *)this);
      puVar13 = (uint8_t *)(insertion_idx + *(long *)(this + 8));
      bVar12 = true;
LAB_001ed32d:
      (__return_storage_ptr__->first).mKeyVals = pDVar14;
      (__return_storage_ptr__->first).mInfo = puVar13;
      __return_storage_ptr__->second = bVar12;
      return __return_storage_ptr__;
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

std::pair<iterator, bool> doInsert(Arg&& keyval) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(getFirstConst(keyval), &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(getFirstConst(keyval), mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair<iterator, bool>(iterator(mKeyVals + idx, mInfo + idx),
                                                          false);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                ::new (static_cast<void*>(&l)) Node(*this, std::forward<Arg>(keyval));
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::forward<Arg>(keyval));
            }

            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return std::make_pair(iterator(mKeyVals + insertion_idx, mInfo + insertion_idx), true);
        }
    }